

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

uint64_t MeCab::fingerprint(char *str,size_t size)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar14 [16];
  
  uVar1 = (uint)size;
  uVar3 = uVar1;
  if ((int)uVar1 < 0) {
    uVar3 = uVar1 + 0xf;
  }
  lVar2 = (long)(int)(uVar3 & 0xfffffff0);
  uVar10 = 0xfd14deff;
  uVar9 = 0xfd14deff;
  uVar11 = 0xfd14deff;
  uVar7 = 0xfd14deff;
  if (0x1e < uVar1 + 0xf) {
    lVar5 = (long)((int)uVar3 >> 4);
    piVar6 = (int *)(str + lVar2 + lVar5 * -0x10 + 0xc);
    uVar7 = 0xfd14deff;
    uVar11 = 0xfd14deff;
    uVar9 = 0xfd14deff;
    uVar10 = 0xfd14deff;
    do {
      uVar7 = ((uint)(piVar6[-3] * 0x239b961b) >> 0x11 | piVar6[-3] * -0x34f28000) * -0x54f16877 ^
              uVar7;
      iVar8 = (uVar7 << 0x13 | uVar7 >> 0xd) + uVar11;
      uVar7 = iVar8 * 5 + 0x561ccd1b;
      uVar11 = ((uint)(piVar6[-2] * -0x54f16877) >> 0x10 | piVar6[-2] * -0x68770000) * 0x38b34ae5 ^
               uVar11;
      uVar11 = ((uVar11 << 0x11 | uVar11 >> 0xf) + uVar9) * 5 + 0xbcaa747;
      uVar9 = ((uint)(piVar6[-1] * 0x38b34ae5) >> 0xf | piVar6[-1] * -0x6a360000) * -0x5e1c746d ^
              uVar9;
      uVar9 = ((uVar9 << 0xf | uVar9 >> 0x11) + uVar10) * 5 + 0x96cd1c35;
      uVar10 = ((uint)(*piVar6 * -0x5e1c746d) >> 0xe | *piVar6 * 0x2e4c0000) * 0x239b961b ^ uVar10;
      uVar10 = ((uVar10 << 0xd | uVar10 >> 0x13) + iVar8 * 5 + 0x561ccd1b) * 5 + 0x32ac3b17;
      piVar6 = piVar6 + 4;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  uVar4 = 0;
  uVar3 = 0;
  switch(uVar1 & 0xf) {
  case 0xf:
    uVar3 = (uint)(byte)str[lVar2 + 0xe] << 0x10;
  case 0xe:
    uVar3 = uVar3 | (uint)(byte)str[lVar2 + 0xd] << 8;
  case 0xd:
    uVar10 = uVar10 ^ (((byte)str[lVar2 + 0xc] ^ uVar3) * -0x5e1c746d >> 0xe |
                      ((byte)str[lVar2 + 0xc] ^ uVar3) * 0x2e4c0000) * 0x239b961b;
  case 0xc:
    uVar3 = (uint)(byte)str[lVar2 + 0xb] << 0x18;
  case 0xb:
    uVar3 = uVar3 | (uint)(byte)str[lVar2 + 10] << 0x10;
  case 10:
    uVar3 = uVar3 ^ (uint)(byte)str[lVar2 + 9] << 8;
  case 9:
    uVar9 = uVar9 ^ (((byte)str[lVar2 + 8] ^ uVar3) * 0x38b34ae5 >> 0xf |
                    ((byte)str[lVar2 + 8] ^ uVar3) * -0x6a360000) * -0x5e1c746d;
  case 8:
    uVar3 = (uint)(byte)str[lVar2 + 7] << 0x18;
  case 7:
    uVar3 = uVar3 | (uint)(byte)str[lVar2 + 6] << 0x10;
  case 6:
    uVar3 = uVar3 ^ (uint)(byte)str[lVar2 + 5] << 8;
  case 5:
    uVar11 = uVar11 ^ (((byte)str[lVar2 + 4] ^ uVar3) * -0x54f16877 >> 0x10 |
                      ((byte)str[lVar2 + 4] ^ uVar3) * -0x68770000) * 0x38b34ae5;
  case 4:
    uVar3 = (uint)(byte)str[lVar2 + 3] << 0x18;
  case 3:
    uVar4 = uVar3 | (uint)(byte)str[lVar2 + 2] << 0x10;
  case 2:
    uVar4 = uVar4 ^ (uint)(byte)str[lVar2 + 1] << 8;
  case 1:
    uVar7 = uVar7 ^ (((byte)str[lVar2] ^ uVar4) * 0x239b961b >> 0x11 |
                    ((byte)str[lVar2] ^ uVar4) * -0x34f28000) * -0x54f16877;
  case 0:
    uVar7 = (uVar7 ^ uVar1) + (uVar11 ^ uVar1) + (uVar9 ^ uVar1) + (uVar10 ^ uVar1);
    uVar3 = (uVar11 ^ uVar1) + uVar7;
    uVar11 = (uVar9 ^ uVar1) + uVar7;
    uVar1 = (uVar10 ^ uVar1) + uVar7;
    auVar16._12_4_ = uVar1;
    auVar16._8_4_ = uVar11;
    auVar16._4_4_ = uVar7;
    auVar16._0_4_ = uVar3;
    auVar12._0_4_ = uVar3 >> 0x10;
    auVar12._4_4_ = uVar7 >> 0x10;
    auVar12._8_4_ = uVar11 >> 0x10;
    auVar12._12_4_ = uVar1 >> 0x10;
    auVar12 = auVar12 ^ auVar16;
    iVar8 = auVar12._4_4_;
    auVar17._4_4_ = iVar8;
    auVar17._0_4_ = iVar8;
    auVar17._8_4_ = auVar12._12_4_;
    auVar17._12_4_ = auVar12._12_4_;
    auVar13._0_4_ = auVar12._0_4_ * -0x7a143595;
    auVar14._8_4_ = (uint)((auVar12._8_8_ & 0xffffffff) * 0x85ebca6b);
    auVar14._4_4_ = auVar14._8_4_;
    auVar14._0_4_ = auVar13._0_4_;
    uVar3 = (uint)((auVar17._8_8_ & 0xffffffff) * 0x85ebca6b);
    auVar14._12_4_ = uVar3;
    auVar13._8_8_ = auVar14._8_8_;
    auVar13._4_4_ = iVar8 * -0x7a143595;
    auVar15._0_4_ = auVar13._0_4_ >> 0xd;
    auVar15._4_4_ = (uint)(iVar8 * -0x7a143595) >> 0xd;
    auVar15._8_4_ = auVar14._8_4_ >> 0xd;
    auVar15._12_4_ = uVar3 >> 0xd;
    auVar15 = auVar15 ^ auVar13;
    iVar8 = auVar15._4_4_;
    auVar18._4_4_ = iVar8;
    auVar18._0_4_ = iVar8;
    auVar18._8_4_ = auVar15._12_4_;
    auVar18._12_4_ = auVar15._12_4_;
    uVar3 = auVar15._0_4_ * -0x3d4d51cb;
    uVar1 = (uint)((auVar15._8_8_ & 0xffffffff) * 0xc2b2ae35);
    uVar11 = (uint)((auVar18._8_8_ & 0xffffffff) * 0xc2b2ae35);
    uVar3 = uVar3 >> 0x10 ^ uVar3;
    iVar8 = (uVar11 >> 0x10 ^ uVar11) + ((uint)(iVar8 * -0x3d4d51cb) >> 0x10 ^ iVar8 * -0x3d4d51cb)
            + (uVar1 >> 0x10 ^ uVar1) + uVar3;
    return CONCAT44(uVar3 + iVar8,iVar8);
  }
}

Assistant:

void MurmurHash3_x86_128(const void * key, const int len,
                         uint32_t seed, char *out) {
  const uint8_t * data = (const uint8_t*)key;
  const int nblocks = len / 16;

  uint32_t h1 = seed;
  uint32_t h2 = seed;
  uint32_t h3 = seed;
  uint32_t h4 = seed;

  uint32_t c1 = 0x239b961b;
  uint32_t c2 = 0xab0e9789;
  uint32_t c3 = 0x38b34ae5;
  uint32_t c4 = 0xa1e38b93;

  //----------
  // body

  const uint32_t * blocks = (const uint32_t *)(data + nblocks*16);

  for(int i = -nblocks; i; i++)
  {
    uint32_t k1 = getblock(blocks,i*4+0);
    uint32_t k2 = getblock(blocks,i*4+1);
    uint32_t k3 = getblock(blocks,i*4+2);
    uint32_t k4 = getblock(blocks,i*4+3);

    k1 *= c1; k1  = ROTL32(k1,15); k1 *= c2; h1 ^= k1;

    h1 = ROTL32(h1,19); h1 += h2; h1 = h1*5+0x561ccd1b;

    k2 *= c2; k2  = ROTL32(k2,16); k2 *= c3; h2 ^= k2;

    h2 = ROTL32(h2,17); h2 += h3; h2 = h2*5+0x0bcaa747;

    k3 *= c3; k3  = ROTL32(k3,17); k3 *= c4; h3 ^= k3;

    h3 = ROTL32(h3,15); h3 += h4; h3 = h3*5+0x96cd1c35;

    k4 *= c4; k4  = ROTL32(k4,18); k4 *= c1; h4 ^= k4;

    h4 = ROTL32(h4,13); h4 += h1; h4 = h4*5+0x32ac3b17;
  }

  //----------
  // tail

  const uint8_t * tail = (const uint8_t*)(data + nblocks*16);
  uint32_t k1 = 0;
  uint32_t k2 = 0;
  uint32_t k3 = 0;
  uint32_t k4 = 0;

  switch(len & 15)
  {
    case 15: k4 ^= tail[14] << 16;
    case 14: k4 ^= tail[13] << 8;
    case 13: k4 ^= tail[12] << 0;
      k4 *= c4; k4  = ROTL32(k4,18); k4 *= c1; h4 ^= k4;

    case 12: k3 ^= tail[11] << 24;
    case 11: k3 ^= tail[10] << 16;
    case 10: k3 ^= tail[ 9] << 8;
    case  9: k3 ^= tail[ 8] << 0;
      k3 *= c3; k3  = ROTL32(k3,17); k3 *= c4; h3 ^= k3;

    case  8: k2 ^= tail[ 7] << 24;
    case  7: k2 ^= tail[ 6] << 16;
    case  6: k2 ^= tail[ 5] << 8;
    case  5: k2 ^= tail[ 4] << 0;
      k2 *= c2; k2  = ROTL32(k2,16); k2 *= c3; h2 ^= k2;

    case  4: k1 ^= tail[ 3] << 24;
    case  3: k1 ^= tail[ 2] << 16;
    case  2: k1 ^= tail[ 1] << 8;
    case  1: k1 ^= tail[ 0] << 0;
      k1 *= c1; k1  = ROTL32(k1,15); k1 *= c2; h1 ^= k1;
  };

  //----------
  // finalization

  h1 ^= len; h2 ^= len; h3 ^= len; h4 ^= len;

  h1 += h2; h1 += h3; h1 += h4;
  h2 += h1; h3 += h1; h4 += h1;

  h1 = fmix(h1);
  h2 = fmix(h2);
  h3 = fmix(h3);
  h4 = fmix(h4);

  h1 += h2; h1 += h3; h1 += h4;
  h2 += h1; h3 += h1; h4 += h1;

  std::memcpy(out, reinterpret_cast<char *>(&h1), 4);
  std::memcpy(out + 4, reinterpret_cast<char *>(&h2), 4);
  std::memcpy(out + 8, reinterpret_cast<char *>(&h3), 4);
  std::memcpy(out+ 12, reinterpret_cast<char *>(&h4), 4);
}